

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,iterator it)

{
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this_00;
  type tVar1;
  type tVar2;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_48;
  format_specs local_28;
  
  this_00 = &this->context;
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)this_00,it.ptr_);
  tVar1 = (this->arg).type_;
  if (tVar1 == custom_type) {
    (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,this_00);
    return;
  }
  if (tVar1 != named_arg_type) {
    local_48.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    specs_ = &local_28;
    local_28.super_align_spec.width_ = 0;
    local_28.super_align_spec.fill_ = L' ';
    local_28.super_align_spec.align_ = ALIGN_DEFAULT;
    local_28.flags_ = 0;
    local_28.precision_ = -1;
    local_28.type_ = '\0';
    local_48.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.out_.container =
         (this->context).
         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         .out_.container;
    local_48.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.locale_._M_t.
    super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>.
    _M_t.
    super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
    .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl =
         (__uniq_ptr_data<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>,_true,_true>
          )(__uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
            )0x0;
    local_48.ctx_ = this_00;
    tVar2 = visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_48,this->arg);
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .out_.container = tVar2.container;
    if ((_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)
        local_48.
        super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
        .writer_.locale_._M_t.
        super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
        ._M_t.
        super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
        .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl !=
        (_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_48.
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          .writer_.locale_._M_t.
          super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
          ._M_t.
          super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
          .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl)[1])();
    }
    return;
  }
  __assert_fail("(false) && \"invalid argument type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                ,0x4b7,
                "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, basic_format_arg<Context>) [Visitor = fmt::internal::custom_formatter<char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
               );
}

Assistant:

void on_replacement_field(iterator it) {
    context.parse_context().advance_to(pointer_from(it));
    if (visit(internal::custom_formatter<Char, Context>(context), arg))
      return;
    basic_format_specs<Char> specs;
    context.advance_to(visit(ArgFormatter(context, specs), arg));
  }